

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropymode.c
# Opt level: O0

void av1_setup_frame_contexts(AV1_COMMON *cm)

{
  RefCntBuffer *pRVar1;
  long in_RDI;
  int i_1;
  RefCntBuffer *buf;
  int i;
  MV_REFERENCE_FRAME in_stack_ffffffffffffffdf;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar2;
  int local_c;
  
  memcpy(*(void **)(in_RDI + 0x6098),*(void **)(in_RDI + 0x6090),0x52fc);
  if (*(int *)(in_RDI + 0x62e4) != 0) {
    for (local_c = 1; local_c < 8; local_c = local_c + 1) {
      pRVar1 = get_ref_frame_buf((AV1_COMMON *)
                                 CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                                 in_stack_ffffffffffffffdf);
      if (pRVar1 != (RefCntBuffer *)0x0) {
        memcpy(&pRVar1->frame_context,*(void **)(in_RDI + 0x6090),0x52fc);
      }
    }
    for (iVar2 = 0; iVar2 < (int)(uint)*(byte *)(*(long *)(in_RDI + 0x62f0) + 0x48);
        iVar2 = iVar2 + 1) {
      memcpy((void *)(*(long *)(*(long *)(in_RDI + 0x62f0) + 0x40) + (long)iVar2 * 0x58e0 + 0x5d8),
             *(void **)(in_RDI + 0x6090),0x52fc);
    }
  }
  return;
}

Assistant:

void av1_setup_frame_contexts(AV1_COMMON *cm) {
  // Store the frame context into a special slot (not associated with any
  // reference buffer), so that we can set up cm->pre_fc correctly later
  // This function must ONLY be called when cm->fc has been initialized with
  // default probs, either by av1_setup_past_independence or after manually
  // initializing them
  *cm->default_frame_context = *cm->fc;
  // TODO(jack.haughton@argondesign.com): don't think this should be necessary,
  // but could do with fuller testing
  if (cm->tiles.large_scale) {
    for (int i = LAST_FRAME; i <= ALTREF_FRAME; ++i) {
      RefCntBuffer *const buf = get_ref_frame_buf(cm, i);
      if (buf != NULL) buf->frame_context = *cm->fc;
    }
    for (int i = 0; i < cm->buffer_pool->num_frame_bufs; ++i)
      cm->buffer_pool->frame_bufs[i].frame_context = *cm->fc;
  }
}